

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_message(upb_encstate *e,upb_Message *msg,upb_MiniTable *m,size_t *size)

{
  char *pcVar1;
  char *pcVar2;
  upb_MiniTableField *puVar3;
  _Bool _Var4;
  int iVar5;
  upb_MiniTableField *first;
  upb_MiniTableField *f;
  char *ptr;
  upb_StringView unknown;
  uintptr_t iter;
  size_t unknown_size;
  size_t pre_len;
  size_t *size_local;
  upb_MiniTable *m_local;
  upb_Message *msg_local;
  upb_encstate *e_local;
  
  pcVar1 = e->limit;
  pcVar2 = e->ptr;
  if ((((e->options & 4U) != 0) && (m->required_count_dont_copy_me__upb_internal_use_only != '\0'))
     && (_Var4 = _upb_Message_IsInitializedShallow_dont_copy_me__upb_internal_use_only(msg,m),
        !_Var4)) {
    encode_err(e,kUpb_EncodeStatus_MissingRequired);
  }
  if ((e->options & 2U) == 0) {
    iter = 0;
    unknown.size = 0;
    while (_Var4 = upb_Message_NextUnknown(msg,(upb_StringView *)&ptr,&unknown.size), _Var4) {
      iter = (uintptr_t)(unknown.data + iter);
    }
    if (iter != 0) {
      if ((ulong)((long)e->ptr - (long)e->buf) < iter) {
        encode_growbuffer(e,iter);
      }
      else {
        e->ptr = e->ptr + -iter;
      }
      f = (upb_MiniTableField *)e->ptr;
      unknown.size = 0;
      while (_Var4 = upb_Message_NextUnknown(msg,(upb_StringView *)&ptr,&unknown.size), _Var4) {
        memcpy(f,ptr,(size_t)unknown.data);
        f = (upb_MiniTableField *)(unknown.data + (long)f);
      }
    }
  }
  encode_exts(e,m,msg);
  iVar5 = upb_MiniTable_FieldCount(m);
  if (iVar5 != 0) {
    first = m->fields_dont_copy_me__upb_internal_use_only +
            m->field_count_dont_copy_me__upb_internal_use_only;
    puVar3 = m->fields_dont_copy_me__upb_internal_use_only;
    while (first != puVar3) {
      first = first + -1;
      _Var4 = encode_shouldencode(e,msg,first);
      if (_Var4) {
        encode_field(e,msg,m->subs_dont_copy_me__upb_internal_use_only,first);
      }
    }
  }
  *size = (size_t)(e->limit + (-((long)pcVar1 - (long)pcVar2) - (long)e->ptr));
  return;
}

Assistant:

static void encode_message(upb_encstate* e, const upb_Message* msg,
                           const upb_MiniTable* m, size_t* size) {
  size_t pre_len = e->limit - e->ptr;

  if (e->options & kUpb_EncodeOption_CheckRequired) {
    if (m->UPB_PRIVATE(required_count)) {
      if (!UPB_PRIVATE(_upb_Message_IsInitializedShallow)(msg, m)) {
        encode_err(e, kUpb_EncodeStatus_MissingRequired);
      }
    }
  }

  if ((e->options & kUpb_EncodeOption_SkipUnknown) == 0) {
    size_t unknown_size = 0;
    uintptr_t iter = kUpb_Message_UnknownBegin;
    upb_StringView unknown;
    // Need to write in reverse order, but iteration is in-order; scan to
    // reserve capacity up front, then write in-order
    while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
      unknown_size += unknown.size;
    }
    if (unknown_size != 0) {
      encode_reserve(e, unknown_size);
      char* ptr = e->ptr;
      iter = kUpb_Message_UnknownBegin;
      while (upb_Message_NextUnknown(msg, &unknown, &iter)) {
        memcpy(ptr, unknown.data, unknown.size);
        ptr += unknown.size;
      }
    }
  }

  encode_exts(e, m, msg);

  if (upb_MiniTable_FieldCount(m)) {
    const upb_MiniTableField* f =
        &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
    const upb_MiniTableField* first = &m->UPB_PRIVATE(fields)[0];
    while (f != first) {
      f--;
      if (encode_shouldencode(e, msg, f)) {
        encode_field(e, msg, m->UPB_PRIVATE(subs), f);
      }
    }
  }

  *size = (e->limit - e->ptr) - pre_len;
}